

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_cor_qt.cpp
# Opt level: O1

void __thiscall sc_core::sc_cor_qt::stack_protect(sc_cor_qt *this,bool enable)

{
  int iVar1;
  ulong uVar2;
  
  if (stack_protect::pagesize == 0) {
    stack_protect::pagesize = sysconf(0x1e);
  }
  if (stack_protect::pagesize == 0) {
    sc_assertion_failed("pagesize != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ucirvinelecs[P]systemc/src/sysc/kernel/sc_cor_qt.cpp"
                        ,0x4d);
  }
  if (this->m_stack_size <= stack_protect::pagesize * 2) {
    sc_assertion_failed("m_stack_size > ( 2 * pagesize )",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ucirvinelecs[P]systemc/src/sysc/kernel/sc_cor_qt.cpp"
                        ,0x4e);
  }
  uVar2 = (long)this->m_stack + (stack_protect::pagesize - 1);
  iVar1 = mprotect((void *)(uVar2 - uVar2 % stack_protect::pagesize),stack_protect::pagesize - 1,
                   (uint)!enable + (uint)!enable * 2);
  if (iVar1 == 0) {
    return;
  }
  sc_assertion_failed("ret == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ucirvinelecs[P]systemc/src/sysc/kernel/sc_cor_qt.cpp"
                      ,0x6a);
}

Assistant:

void
sc_cor_qt::stack_protect( bool enable )
{
    // Code needs to be tested on HP-UX and disabled if it doesn't work there
    // Code still needs to be ported to WIN32

    static std::size_t pagesize;

    if( pagesize == 0 ) {
#       if defined(__ppc__)
	    pagesize = getpagesize();
#       else
	    pagesize = sysconf( _SC_PAGESIZE );
#       endif
    }

    sc_assert( pagesize != 0 );
    sc_assert( m_stack_size > ( 2 * pagesize ) );

#ifdef QUICKTHREADS_GROW_DOWN
    // Stacks grow from high address down to low address
    caddr_t redzone = caddr_t( ( ( std::size_t( m_stack ) + pagesize - 1 ) /
				 pagesize ) * pagesize );
#else
    // Stacks grow from low address up to high address
    caddr_t redzone = caddr_t( ( ( std::size_t( m_stack ) +
				   m_stack_size - pagesize ) /
				 pagesize ) * pagesize );
#endif

    int ret;

    // Enable the red zone at the end of the stack so that references within
    // it will cause an interrupt.

    if( enable ) {
        ret = mprotect( redzone, pagesize - 1, PROT_NONE );
    }

    // Revert the red zone to normal memory usage.

    else {
        ret = mprotect( redzone, pagesize - 1, PROT_READ | PROT_WRITE );
    }

    sc_assert( ret == 0 );
}